

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_convert_tile_tsbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  void *__ptr;
  long lVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != -128.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar6 = 0x19d;
  }
  else {
    uVar7 = (ulong)(uint)outfptr->Fptr->compress_type;
    if ((uVar7 < 0x34) && ((0x8000000600800U >> (uVar7 & 0x3f) & 1) != 0)) {
      *intlength = 1;
      if (nullcheck == 1) {
        cVar2 = *nullflagval;
        for (; 0 < tilelen; tilelen = tilelen + -1) {
          cVar3 = *(char *)((long)tiledata + tilelen + -1);
          cVar5 = cVar3 + -0x80;
          if (cVar3 == cVar2) {
            cVar5 = (char)nullval;
          }
          *(char *)((long)tiledata + tilelen + -1) = cVar5;
        }
      }
      else {
        for (; 0 < tilelen; tilelen = tilelen + -1) {
          pbVar1 = (byte *)((long)tiledata + tilelen + -1);
          *pbVar1 = *pbVar1 ^ 0x80;
        }
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        cVar2 = *nullflagval;
        for (; 0 < tilelen; tilelen = tilelen + -1) {
          cVar3 = *(char *)((long)tiledata + tilelen + -1);
          iVar6 = cVar3 + 0x80;
          if (cVar3 == cVar2) {
            iVar6 = nullval;
          }
          *(int *)((long)tiledata + tilelen * 4 + -4) = iVar6;
        }
      }
      else if (*status < 1) {
        lVar8 = 10000;
        if (tilelen < 10000) {
          lVar8 = tilelen;
        }
        __ptr = malloc(lVar8 * 4);
        if (__ptr == (void *)0x0) {
          ffpmsg("Out of memory. (fits_sbyte_to_int_inplace)");
          *status = 0x71;
        }
        else {
          lVar4 = tilelen - lVar8;
          while (lVar9 = lVar4, 0 < lVar8) {
            for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
              *(int *)((long)__ptr + lVar4 * 4) = *(char *)((long)tiledata + lVar4 + lVar9) + 0x80;
            }
            memcpy((void *)((long)tiledata + lVar9 * 4),__ptr,lVar8 * 4);
            lVar4 = lVar9 + -10000;
            if (lVar9 < 0x2711) {
              lVar4 = 0;
              lVar8 = lVar9;
            }
            if (lVar9 == 0) {
              lVar8 = lVar9;
            }
          }
          free(__ptr);
        }
      }
    }
    iVar6 = *status;
  }
  return iVar6;
}

Assistant:

int imcomp_convert_tile_tsbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    signed char *sbbuff;

       /* datatype of input array is signed byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = -128.  */

       if (zbitpix != BYTE_IMG|| scale != 1.0 || zero != -128.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       }

       idata = (int *) tiledata;
       sbbuff = (signed char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               /* offset the other pixel values (by flipping the MSB) */

               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       sbbuff[ii] = (signed char) nullval;
                    else
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;               }
           } else {  /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--) 
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;
           }

       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = ((int) sbbuff[ii]) + 128;
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbbuff to an I*4 array, in place */
                 /* sbbuff must have been allocated large enough to do this */
                 fits_sbyte_to_int_inplace(sbbuff, tilelen, status);
           }
       }
 
       return(*status);
}